

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall
FIX::Session::populateRejectReason(Session *this,Message *reject,int field,string *text)

{
  Message *pMVar1;
  bool bVar2;
  FieldMap *this_00;
  StringField *lhs;
  ostream *poVar3;
  STRING local_2f0;
  FieldBase local_2d0;
  stringstream local_278 [8];
  stringstream stream;
  ostream local_268 [376];
  FieldBase local_f0;
  FieldBase local_88;
  StringField *local_30;
  MsgType *msgType;
  string *text_local;
  Message *pMStack_18;
  int field_local;
  Message *reject_local;
  Session *this_local;
  
  msgType = (MsgType *)text;
  text_local._4_4_ = field;
  pMStack_18 = reject;
  reject_local = (Message *)this;
  this_00 = &Message::getHeader(reject)->super_FieldMap;
  local_30 = &FieldMap::getField<FIX::MsgType>(this_00)->super_StringField;
  bVar2 = FIX::operator==(local_30,"3");
  if (bVar2) {
    lhs = &SessionID::getBeginString(&this->m_sessionID)->super_StringField;
    bVar2 = operator>=(lhs,"FIX.4.2");
    pMVar1 = pMStack_18;
    if (bVar2) {
      RefTagID::RefTagID((RefTagID *)&local_88,text_local._4_4_);
      FieldMap::setField(&pMVar1->super_FieldMap,&local_88,true);
      RefTagID::~RefTagID((RefTagID *)&local_88);
      pMVar1 = pMStack_18;
      Text::Text((Text *)&local_f0,(STRING *)msgType);
      FieldMap::setField(&pMVar1->super_FieldMap,&local_f0,true);
      Text::~Text((Text *)&local_f0);
      return;
    }
  }
  std::__cxx11::stringstream::stringstream(local_278);
  poVar3 = std::operator<<(local_268,(string *)msgType);
  poVar3 = std::operator<<(poVar3," (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,text_local._4_4_);
  std::operator<<(poVar3,")");
  pMVar1 = pMStack_18;
  std::__cxx11::stringstream::str();
  Text::Text((Text *)&local_2d0,&local_2f0);
  FieldMap::setField(&pMVar1->super_FieldMap,&local_2d0,true);
  Text::~Text((Text *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::stringstream::~stringstream(local_278);
  return;
}

Assistant:

void Session::populateRejectReason(Message &reject, int field, const std::string &text) {
  auto const &msgType = reject.getHeader().getField<MsgType>();

  if (msgType == MsgType_Reject && m_sessionID.getBeginString() >= FIX::BeginString_FIX42) {
    reject.setField(RefTagID(field));
    reject.setField(Text(text));
  } else {
    std::stringstream stream;
    stream << text << " (" << field << ")";
    reject.setField(Text(stream.str()));
  }
}